

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O1

intptr_t mock_(TestReporter *test_reporter,char *function,char *mock_file,int mock_line,
              char *parameters,...)

{
  undefined4 uVar1;
  undefined8 uVar2;
  void *__src;
  size_t __size;
  bool bVar3;
  CgreenValue CVar4;
  CgreenValue CVar5;
  CgreenValue value;
  bool bVar6;
  char in_AL;
  _Bool _Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  CgreenVector *vector;
  CgreenVector *vector_00;
  intptr_t *piVar11;
  CgreenValue *item;
  CgreenVector *pCVar12;
  char *pcVar13;
  undefined4 *puVar14;
  RecordedExpectation *pRVar15;
  int *piVar16;
  char *pcVar17;
  Constraint *pCVar18;
  undefined1 (*pauVar19) [16];
  void *__dest;
  ulong uVar20;
  undefined8 in_R9;
  int iVar21;
  undefined8 in_XMM0_Qa;
  double dVar22;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list actuals;
  CgreenValue actual;
  RecordedExpectation *local_178;
  undefined1 local_158 [16];
  size_t local_148;
  char *local_138;
  char *local_130;
  ulong local_128;
  intptr_t *local_120;
  undefined1 *local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  size_t local_f8;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_130 = mock_file;
  local_c0 = in_R9;
  iVar8 = cgreen_vector_size(global_expectation_queue);
  iVar21 = 0;
  if (0 < iVar8) {
    iVar8 = 0;
    do {
      local_178 = (RecordedExpectation *)cgreen_vector_get(global_expectation_queue,iVar8);
      iVar9 = strcmp(local_178->function,function);
      if (iVar9 == 0) goto LAB_0010a53f;
      iVar8 = iVar8 + 1;
      iVar9 = cgreen_vector_size(global_expectation_queue);
    } while (iVar8 < iVar9);
  }
  local_178 = (RecordedExpectation *)0x0;
LAB_0010a53f:
  vector = create_vector_of_names(parameters);
  local_128 = 0x3000000028;
  local_120 = (intptr_t *)&stack0x00000008;
  local_118 = local_e8;
  if (*parameters != '\0') {
    iVar21 = 1;
    pcVar13 = parameters;
    do {
      if (*pcVar13 == ',') {
        iVar21 = iVar21 + 1;
      }
      else if (*pcVar13 == '\0') break;
      pcVar13 = pcVar13 + 1;
    } while( true );
  }
  vector_00 = create_cgreen_vector(free);
  if (0 < iVar21) {
    do {
      uVar20 = local_128 & 0xffffffff;
      if (uVar20 < 0x29) {
        local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
        piVar11 = (intptr_t *)(local_118 + uVar20);
      }
      else {
        piVar11 = local_120;
        local_120 = local_120 + 1;
      }
      make_cgreen_integer_value((CgreenValue *)local_158,*piVar11);
      value.value = (anon_union_8_4_d526cc82_for_value)local_148;
      value._0_8_ = local_158._8_8_;
      value.value_size = (size_t)vector;
      item = create_cgreen_value(value);
      cgreen_vector_add(vector_00,item);
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  local_138 = parameters;
  pCVar12 = create_vector_of_double_markers_for(parameters);
  iVar8 = cgreen_vector_size(pCVar12);
  if (0 < iVar8) {
    iVar8 = 0;
    do {
      pcVar13 = (char *)cgreen_vector_get(pCVar12,iVar8);
      if (*pcVar13 == '\x01') {
        puVar14 = (undefined4 *)cgreen_vector_get(vector_00,iVar8);
        uVar1 = puVar14[1];
        uVar2 = *(undefined8 *)(puVar14 + 4);
        dVar22 = unbox_double(*(intptr_t *)(puVar14 + 2));
        *puVar14 = 2;
        puVar14[1] = uVar1;
        *(double *)(puVar14 + 2) = dVar22;
        *(undefined8 *)(puVar14 + 4) = uVar2;
      }
      iVar8 = iVar8 + 1;
      iVar21 = cgreen_vector_size(pCVar12);
    } while (iVar8 < iVar21);
  }
  destroy_cgreen_vector(pCVar12);
  if (local_178 == (RecordedExpectation *)0x0) {
    if (cgreen_mocks_are_ == strict_mocks) {
      pCVar12 = create_cgreen_vector(destroy_constraint);
      pRVar15 = create_recorded_expectation(function,local_130,mock_line,pCVar12);
      pcVar13 = pRVar15->function;
      iVar8 = cgreen_vector_size(successfully_mocked_calls);
      bVar3 = 0 < iVar8;
      if (0 < iVar8) {
        pcVar17 = (char *)cgreen_vector_get(successfully_mocked_calls,0);
        iVar8 = strcmp(pcVar17,pcVar13);
        if (iVar8 != 0) {
          iVar8 = 1;
          do {
            iVar21 = cgreen_vector_size(successfully_mocked_calls);
            bVar3 = iVar8 < iVar21;
            if (iVar21 <= iVar8) goto LAB_0010a8d9;
            pcVar17 = (char *)cgreen_vector_get(successfully_mocked_calls,iVar8);
            iVar21 = strcmp(pcVar17,pcVar13);
            iVar8 = iVar8 + 1;
          } while (iVar21 != 0);
        }
        bVar3 = true;
      }
LAB_0010a8d9:
      pcVar17 = "Mocked function [%s] did not have an expectation that it would be called";
      if (bVar3) {
        pcVar17 = "Mocked function [%s] was called too many times";
      }
      (*test_reporter->assert_true)
                (test_reporter,current_test->filename,current_test->line,0,pcVar17,pcVar13);
      destroy_cgreen_vector(pRVar15->constraints);
      pRVar15->test_line = 0;
      pRVar15->time_to_live = 0;
      pRVar15->constraints = (CgreenVector *)0x0;
      pRVar15->function = (char *)0x0;
      pRVar15->test_file = (char *)0x0;
      pRVar15->number_times_called = 0;
      pRVar15->times_triggered = 0;
      free(pRVar15);
    }
    else if (cgreen_mocks_are_ == learning_mocks) {
      pCVar12 = create_cgreen_vector(destroy_constraint);
      iVar8 = cgreen_vector_size(vector);
      if (0 < iVar8) {
        iVar8 = 0;
        do {
          pcVar13 = (char *)cgreen_vector_get(vector,iVar8);
          piVar16 = (int *)cgreen_vector_get(vector_00,iVar8);
          if (*piVar16 == 2) {
            pCVar18 = create_equal_to_double_constraint(*(double *)(piVar16 + 2),pcVar13);
          }
          else {
            pCVar18 = create_equal_to_value_constraint((intptr_t)*(double *)(piVar16 + 2),pcVar13);
          }
          cgreen_vector_add(pCVar12,pCVar18);
          iVar8 = iVar8 + 1;
          iVar21 = cgreen_vector_size(vector);
        } while (iVar8 < iVar21);
      }
      pRVar15 = create_recorded_expectation(function,local_130,mock_line,pCVar12);
      if (learned_mock_calls == (CgreenVector *)0x0) {
        learned_mock_calls = create_cgreen_vector((_func_void_void_ptr *)0x0);
      }
      cgreen_vector_add(learned_mock_calls,pRVar15);
    }
    destroy_cgreen_vector(vector_00);
    destroy_cgreen_vector(vector);
    __dest = (void *)0x0;
  }
  else if (local_178->time_to_live == -0xf314159) {
    local_178->times_triggered = local_178->times_triggered + 1;
    __dest = (void *)0x0;
    (*test_reporter->assert_true)
              (test_reporter,local_178->test_file,local_178->test_line,0,
               "Mocked function [%s] has an expectation that it will never be called, but it was",
               local_178->function);
    destroy_cgreen_vector(vector_00);
    destroy_cgreen_vector(vector);
  }
  else {
    if (successfully_mocked_calls == (CgreenVector *)0x0) {
      successfully_mocked_calls = create_cgreen_vector((_func_void_void_ptr *)0x0);
    }
    cgreen_vector_add(successfully_mocked_calls,function);
    pCVar12 = local_178->constraints;
    iVar8 = cgreen_vector_size(pCVar12);
    bVar3 = 0 < iVar8;
    if (0 < iVar8) {
      iVar8 = 0;
      do {
        piVar16 = (int *)cgreen_vector_get(pCVar12,iVar8);
        iVar21 = *piVar16;
        if (iVar21 == 4) {
LAB_0010a953:
          iVar8 = piVar16[0x10];
          __dest = *(void **)(piVar16 + 0x12);
LAB_0010a985:
          if (bVar3) goto LAB_0010a990;
          break;
        }
        if (iVar21 == 9) {
          iVar8 = piVar16[0x10];
          __src = *(void **)(piVar16 + 0x12);
          __size = *(size_t *)(piVar16 + 0x14);
          __dest = malloc(__size);
          memcpy(__dest,__src,__size);
          goto LAB_0010a985;
        }
        if (iVar21 == 6) goto LAB_0010a953;
        iVar8 = iVar8 + 1;
        iVar21 = cgreen_vector_size(pCVar12);
        bVar3 = iVar8 < iVar21;
      } while (iVar8 < iVar21);
    }
    iVar8 = 0;
    __dest = (void *)0x0;
LAB_0010a990:
    iVar21 = cgreen_vector_size(local_178->constraints);
    bVar3 = 0 < iVar21;
    if (0 < iVar21) {
      iVar21 = 0;
      do {
        pCVar18 = (Constraint *)cgreen_vector_get(local_178->constraints,iVar21);
        if (pCVar18->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
          local_178->number_times_called = local_178->number_times_called + 1;
          bVar6 = false;
        }
        else {
          _Var7 = is_parameter(pCVar18);
          bVar6 = false;
          if (_Var7) {
            _Var7 = constraint_is_for_parameter_in(pCVar18,local_138);
            bVar6 = false;
            if (!_Var7) {
              (*test_reporter->assert_true)
                        (test_reporter,local_178->test_file,local_178->test_line,0,
                         "Mocked function [%s] did not define a parameter named [%s]. Did you misspell it in the expectation or forget it in the mock\'s argument list?"
                         ,local_178->function,pCVar18->parameter_name);
              destroy_expectation_if_time_to_die(local_178);
              destroy_cgreen_vector(vector_00);
              destroy_cgreen_vector(vector);
              bVar6 = true;
            }
          }
        }
        if (bVar6) break;
        iVar21 = iVar21 + 1;
        iVar9 = cgreen_vector_size(local_178->constraints);
        bVar3 = iVar21 < iVar9;
      } while (iVar21 < iVar9);
    }
    if (!bVar3) {
      local_138 = (char *)CONCAT44(local_138._4_4_,test_reporter->failures);
      iVar21 = cgreen_vector_size(vector);
      if (0 < iVar21) {
        iVar21 = 0;
        do {
          pcVar13 = (char *)cgreen_vector_get(vector,iVar21);
          pauVar19 = (undefined1 (*) [16])cgreen_vector_get(vector_00,iVar21);
          local_148 = *(size_t *)pauVar19[1];
          local_108 = *(undefined8 *)*pauVar19;
          uStack_100 = *(undefined8 *)(*pauVar19 + 8);
          local_158 = *pauVar19;
          local_f8 = local_148;
          iVar9 = cgreen_vector_size(local_178->constraints);
          if (0 < iVar9) {
            iVar9 = 0;
            do {
              pCVar18 = (Constraint *)cgreen_vector_get(local_178->constraints,iVar9);
              _Var7 = is_content_setting(pCVar18);
              if (((!_Var7) && (pCVar18->type != CGREEN_CALL_CONSTRAINT)) &&
                 (_Var7 = constraint_is_not_for_parameter(pCVar18,pcVar13), !_Var7)) {
                CVar4.value_size = local_148;
                CVar4.type = local_158._0_4_;
                CVar4._4_4_ = local_158._4_4_;
                CVar4.value = (anon_union_8_4_d526cc82_for_value)local_158._8_8_;
                (*pCVar18->execute)(pCVar18,local_178->function,CVar4,local_178->test_file,
                                    local_178->test_line,test_reporter);
              }
              iVar9 = iVar9 + 1;
              iVar10 = cgreen_vector_size(local_178->constraints);
            } while (iVar9 < iVar10);
          }
          iVar21 = iVar21 + 1;
          iVar9 = cgreen_vector_size(vector);
        } while (iVar21 < iVar9);
      }
      if (((int)local_138 == test_reporter->failures) &&
         (iVar21 = cgreen_vector_size(vector), 0 < iVar21)) {
        iVar21 = 0;
        do {
          pcVar13 = (char *)cgreen_vector_get(vector,iVar21);
          pauVar19 = (undefined1 (*) [16])cgreen_vector_get(vector_00,iVar21);
          local_148 = *(size_t *)pauVar19[1];
          local_108 = *(undefined8 *)*pauVar19;
          uStack_100 = *(undefined8 *)(*pauVar19 + 8);
          local_158 = *pauVar19;
          local_f8 = local_148;
          iVar9 = cgreen_vector_size(local_178->constraints);
          if (0 < iVar9) {
            iVar9 = 0;
            do {
              pCVar18 = (Constraint *)cgreen_vector_get(local_178->constraints,iVar9);
              _Var7 = constraint_is_not_for_parameter(pCVar18,pcVar13);
              if ((!_Var7) && (pCVar18->type == CGREEN_CONTENT_SETTER_CONSTRAINT)) {
                CVar5.value_size = local_148;
                CVar5.type = local_158._0_4_;
                CVar5._4_4_ = local_158._4_4_;
                CVar5.value = (anon_union_8_4_d526cc82_for_value)local_158._8_8_;
                (*pCVar18->execute)(pCVar18,local_178->function,CVar5,local_178->test_file,
                                    local_178->test_line,test_reporter);
              }
              iVar9 = iVar9 + 1;
              iVar10 = cgreen_vector_size(local_178->constraints);
            } while (iVar9 < iVar10);
          }
          iVar21 = iVar21 + 1;
          iVar9 = cgreen_vector_size(vector);
        } while (iVar21 < iVar9);
      }
      iVar21 = cgreen_vector_size(local_178->constraints);
      if (0 < iVar21) {
        iVar21 = 0;
        do {
          piVar16 = (int *)cgreen_vector_get(local_178->constraints,iVar21);
          if (*piVar16 == 7) {
            local_158 = (undefined1  [16])0x0;
            local_148 = 0;
            (**(code **)(piVar16 + 8))
                      (piVar16,local_178->function,local_178->test_file,local_178->test_line,
                       test_reporter);
          }
          iVar21 = iVar21 + 1;
          iVar9 = cgreen_vector_size(local_178->constraints);
        } while (iVar21 < iVar9);
      }
      destroy_cgreen_vector(vector);
      destroy_cgreen_vector(vector_00);
      local_178->times_triggered = local_178->times_triggered + 1;
      destroy_expectation_if_time_to_die(local_178);
      if (iVar8 == 2) {
        __dest = (void *)box_double((double)__dest);
      }
    }
  }
  return (intptr_t)__dest;
}

Assistant:

intptr_t mock_(TestReporter* test_reporter, const char *function, const char *mock_file, int mock_line, const char *parameters, ...) {
    va_list actuals;
    CgreenVector *actual_values;
    CgreenVector *parameter_names;
    int failures_before_read_only_constraints_executed;
    int failures_after_read_only_constraints_executed;
    CgreenValue stored_result;
    RecordedExpectation *expectation = find_expectation(function);

    parameter_names = create_vector_of_names(parameters);

    va_start(actuals, parameters);
    actual_values = create_vector_of_actuals(actuals, number_of_parameters_in(parameters));
    va_end(actuals);

    convert_boxed_doubles_to_cgreen_values(parameters, actual_values);

    if (expectation == NULL) {
        handle_missing_expectation_for(function, mock_file, mock_line, parameter_names, actual_values, test_reporter);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    if (is_never_call(expectation)) {
        expectation->times_triggered++;
        report_violated_never_call(test_reporter, expectation);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    ensure_successfully_mocked_calls_list_exists();
    cgreen_vector_add(successfully_mocked_calls, (void*)function);

    stored_result = stored_result_or_default_for(expectation->constraints);
    // FIXME: Should verify that return value is not a DOUBLE as `mock_()' can not
    // return them. There should also be a 'mock_double_()' which does the same except
    // returning a double.

    // First check all actual constraints for validity...
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (constraint->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
            expectation->number_times_called++;
            continue;
        }

        if (!is_parameter(constraint))
            continue;

        if (!constraint_is_for_parameter_in(constraint, parameters)) {
            // if expectation parameter name isn't in parameter_names,
            // fail test and skip applying constraints unlikely to match
            report_mock_parameter_name_not_found(test_reporter, expectation, constraint->parameter_name);
            destroy_expectation_if_time_to_die(expectation);
            destroy_cgreen_vector(actual_values);
            destroy_cgreen_vector(parameter_names);

            return stored_result.value.integer_value;
        }
    }

    // Now we can do the read-only constraints.  If read-only
    // constraints aren't matching, content-setting ones might corrupt
    // memory so apply read-only ones first, and if they don't fail,
    // then do the deeper constraints
    failures_before_read_only_constraints_executed = test_reporter->failures;

    for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
        const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
        CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
        apply_any_read_only_parameter_constraints(expectation, parameter_name, actual, test_reporter);
    }

    failures_after_read_only_constraints_executed = test_reporter->failures;

    // And now we can do the content setting constraints...
    // FIXME: this comparison doesn't work because only parent
    //        processes' pass/fail counts are updated, and even then
    //        only once they read from the pipe
    if (failures_before_read_only_constraints_executed == failures_after_read_only_constraints_executed) {
        for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
            const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
            CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
            apply_any_content_setting_parameter_constraints(expectation, parameter_name, actual, test_reporter);
        }
    }

    // And finally run all side effects
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (is_side_effect_constraint(constraint)) {
            apply_side_effect(test_reporter, expectation, constraint);
            continue;
        }
    }



    destroy_cgreen_vector(parameter_names);
    destroy_cgreen_vector(actual_values);

    expectation->times_triggered++;
    destroy_expectation_if_time_to_die(expectation);

    if (stored_result.type == CGREEN_DOUBLE) {
#ifdef FUTURE
        /* TODO: for some future version we should ensure that the
           user is not trying to return a double through 'mock()' when
           there is a 'mock_double()' available, which there isn't
           yet. So then

               return unbox_double(mock(...));

           should be replaced by

               return mock_double(...);
        */
        test_reporter->assert_true(test_reporter,
                                   mock_file,
                                   mock_line,
                                   false,
                                   "Mocked function [%s] have a 'will_return_double()' expectation, "
                                   "but 'mock()' cannot return doubles; Use 'mock_double()' instead",
                                   function);
        /* But we'll return it anyway, whatever it becomes is what he will get... */
        return stored_result.value.double_value;
#else
        /* ... but for now return a boxed double since the user is probably using

               return unbox_double(mock(...));

           as is the standard way in 1.x
        */
        return box_double(stored_result.value.double_value);
#endif
    } else
        return stored_result.value.integer_value;
}